

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcolor.hpp
# Opt level: O0

ostream * termcolor::yellow(ostream *stream)

{
  bool bVar1;
  ostream *in_RDI;
  
  bVar1 = _internal::is_colorized(stream);
  if (bVar1) {
    std::operator<<(in_RDI,"\x1b[33m");
  }
  return in_RDI;
}

Assistant:

inline std::ostream &yellow(std::ostream &stream) {
	if (_internal::is_colorized(stream)) {
#if defined(TERMCOLOR_OS_MACOS) || defined(TERMCOLOR_OS_LINUX)
		stream << "\033[33m";
#elif defined(TERMCOLOR_OS_WINDOWS)
		_internal::win_change_attributes(stream, FOREGROUND_GREEN | FOREGROUND_RED);
#endif
	}
	return stream;
}